

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh.c
# Opt level: O2

double c_tanh(double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if ((x != 0.0) || (dVar1 = x, NAN(x))) {
    dVar1 = ABS(x);
    if (dVar1 <= MAXLOG * 0.5) {
      if (0.625 <= dVar1) {
        dVar1 = c_exp(dVar1 + dVar1);
        dVar1 = -2.0 / (dVar1 + 1.0) + 1.0;
        if (x < 0.0) {
          dVar1 = -dVar1;
        }
      }
      else {
        dVar1 = x * x;
        dVar2 = polevl(dVar1,P,2);
        dVar3 = p1evl(dVar1,Q,3);
        dVar1 = x + dVar1 * x * (dVar2 / dVar3);
      }
    }
    else {
      dVar1 = *(double *)(&DAT_005abe00 + (ulong)(0.0 < x) * 8);
    }
  }
  return dVar1;
}

Assistant:

double c_tanh(x)
double x;
{
double s, z;

#ifdef MINUSZERO
if( x == 0.0 )
	return(x);
#endif
z = fabs(x);
if( z > 0.5 * MAXLOG )
	{
	if( x > 0 )
		return( 1.0 );
	else
		return( -1.0 );
	}
if( z >= 0.625 )
	{
	s = c_exp(2.0*z);
	z =  1.0  - 2.0/(s + 1.0);
	if( x < 0 )
		z = -z;
	}
else
	{
	if( x == 0.0 )
	  return(x);
	s = x * x;
	z = polevl( s, P, 2 )/p1evl(s, Q, 3);
	z = x * s * z;
	z = x + z;
	}
return( z );
}